

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::PrintMessageDescriptors
          (Generator *this,StripPrintDescriptor print_mode)

{
  int i_1;
  long lVar1;
  int i;
  long lVar2;
  
  if (print_mode == kCreate) {
    lVar2 = 0;
    for (lVar1 = 0; lVar1 < *(int *)(this->file_ + 0x2c); lVar1 = lVar1 + 1) {
      PrintCreateDescriptor(this,(Descriptor *)(*(long *)(this->file_ + 0x58) + lVar2));
      io::Printer::Print<>(this->printer_,"\n");
      lVar2 = lVar2 + 0x88;
    }
  }
  else {
    lVar1 = 0;
    for (lVar2 = 0; lVar2 < *(int *)(this->file_ + 0x2c); lVar2 = lVar2 + 1) {
      PrintFindDescriptor(this,(Descriptor *)(*(long *)(this->file_ + 0x58) + lVar1));
      lVar1 = lVar1 + 0x88;
    }
  }
  return;
}

Assistant:

void Generator::PrintMessageDescriptors(StripPrintDescriptor print_mode) const {
  if (print_mode == StripPrintDescriptor::kCreate) {
    for (int i = 0; i < file_->message_type_count(); ++i) {
      PrintCreateDescriptor(*file_->message_type(i));
      printer_->Print("\n");
    }
  } else {
    for (int i = 0; i < file_->message_type_count(); ++i) {
      PrintFindDescriptor(*file_->message_type(i));
    }
  }
}